

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct.pb.cc
# Opt level: O0

size_t __thiscall google::protobuf::ListValue::ByteSizeLong(ListValue *this)

{
  bool bVar1;
  int iVar2;
  RepeatedPtrField<google::protobuf::Value> *this_00;
  reference value;
  size_t sVar3;
  Value *msg;
  const_iterator __end3;
  const_iterator __begin3;
  RepeatedPtrField<google::protobuf::Value> *__range3;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  ListValue *this_;
  ListValue *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  iVar2 = _internal_values_size(this);
  sStack_58 = (size_t)iVar2;
  this_00 = _internal_values(this);
  __end3 = RepeatedPtrField<google::protobuf::Value>::begin(this_00);
  msg = (Value *)RepeatedPtrField<google::protobuf::Value>::end(this_00);
  while( true ) {
    bVar1 = internal::operator!=(&__end3,(iterator *)&msg);
    if (!bVar1) break;
    value = internal::RepeatedPtrIterator<const_google::protobuf::Value>::operator*(&__end3);
    sVar3 = internal::WireFormatLite::MessageSize<google::protobuf::Value>(value);
    sStack_58 = sVar3 + sStack_58;
    internal::RepeatedPtrIterator<const_google::protobuf::Value>::operator++(&__end3);
  }
  sVar3 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar3;
}

Assistant:

::size_t ListValue::ByteSizeLong() const {
  const ListValue& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.ListValue)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .google.protobuf.Value values = 1;
    {
      total_size += 1UL * this_._internal_values_size();
      for (const auto& msg : this_._internal_values()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}